

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

roaring64_bitmap_t * roaring64_bitmap_or(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  int iVar1;
  roaring64_bitmap_t *r;
  container_t *pcVar2;
  leaf_t lVar3;
  bool bVar4;
  art_iterator_t *iterator;
  bool bVar5;
  uint8_t result_typecode;
  art_iterator_t it2;
  art_iterator_t it1;
  uint8_t local_159;
  roaring64_bitmap_t *local_158;
  art_iterator_t local_150;
  art_iterator_t local_c0;
  
  r = (roaring64_bitmap_t *)roaring_malloc(0xb8);
  art_init_cleared((art_t *)r);
  r->flags = '\0';
  r->first_free = 0;
  r->capacity = 0;
  r->containers = (container_t **)0x0;
  art_init_iterator(&local_c0,&r1->art,true);
  local_158 = r2;
  art_init_iterator(&local_150,&r2->art,true);
LAB_00107cb4:
  while( true ) {
    bVar4 = local_c0.value == (ulong *)0x0;
    bVar5 = local_150.value != (ulong *)0x0;
    if (bVar4 && !bVar5) {
      return r;
    }
    iVar1 = 0;
    if (((!bVar4) && (bVar5)) && (iVar1 = art_compare_keys(local_c0.key,local_150.key), iVar1 == 0))
    {
      pcVar2 = container_or(r1->containers[*local_c0.value >> 8],(uint8_t)*local_c0.value,
                            local_158->containers[*local_150.value >> 8],(uint8_t)*local_150.value,
                            &local_159);
      lVar3 = add_container(r,pcVar2,local_159);
      art_insert((art_t *)r,local_c0.key,lVar3);
      art_iterator_next(&local_c0);
      art_iterator_next(&local_150);
      iVar1 = 0;
    }
    if (!bVar4) break;
    if (iVar1 < 0) goto LAB_00107d7a;
LAB_00107dcb:
    if (!bVar4) goto code_r0x00107dd0;
    if (bVar5 || 0 < iVar1) goto LAB_00107de4;
  }
  if (bVar5 && -1 < iVar1) goto LAB_00107dcb;
LAB_00107d7a:
  local_159 = (uint8_t)*local_c0.value;
  pcVar2 = get_copy_of_container(r1->containers[*local_c0.value >> 8],&local_159,false);
  lVar3 = add_container(r,pcVar2,local_159);
  art_insert((art_t *)r,local_c0.key,lVar3);
  iterator = &local_c0;
  goto LAB_00107e31;
code_r0x00107dd0:
  if (0 < iVar1) {
LAB_00107de4:
    local_159 = (uint8_t)*local_150.value;
    pcVar2 = get_copy_of_container(local_158->containers[*local_150.value >> 8],&local_159,false);
    lVar3 = add_container(r,pcVar2,local_159);
    art_insert((art_t *)r,local_150.key,lVar3);
    iterator = &local_150;
LAB_00107e31:
    art_iterator_next(iterator);
  }
  goto LAB_00107cb4;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_or(const roaring64_bitmap_t *r1,
                                        const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator((art_t *)&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> output it1, it1++
        // 2. !it1_present && it2_present  -> output it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 | it2, it1++, it2++
        //    c. it1 >  it2 -> output it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t leaf1 = (leaf_t)*it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;
                uint8_t result_typecode;
                container_t *result_container =
                    container_or(get_container(r1, leaf1), get_typecode(leaf1),
                                 get_container(r2, leaf2), get_typecode(leaf2),
                                 &result_typecode);
                leaf_t result_leaf =
                    add_container(result, result_container, result_typecode);
                art_insert(&result->art, it1.key, (art_val_t)result_leaf);
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            leaf_t result_leaf =
                copy_leaf_container(r1, result, (leaf_t)*it1.value);
            art_insert(&result->art, it1.key, (art_val_t)result_leaf);
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t result_leaf =
                copy_leaf_container(r2, result, (leaf_t)*it2.value);
            art_insert(&result->art, it2.key, (art_val_t)result_leaf);
            art_iterator_next(&it2);
        }
    }
    return result;
}